

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O2

Scalar * __thiscall
Eigen::SparseMatrix<float,_1,_int>::insertBackUncompressed
          (SparseMatrix<float,_1,_int> *this,Index row,Index col)

{
  Scalar *pSVar1;
  int iVar2;
  StorageIndex *pSVar3;
  int iVar4;
  
  pSVar3 = this->m_innerNonZeros;
  if (pSVar3 == (StorageIndex *)0x0) {
    __assert_fail("!isCompressed()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/SparseCore/SparseMatrix.h"
                  ,899,
                  "Scalar &Eigen::SparseMatrix<float, 1>::insertBackUncompressed(Index, Index) [_Scalar = float, _Options = 1, _StorageIndex = int]"
                 );
  }
  iVar2 = pSVar3[row];
  iVar4 = this->m_outerIndex[row];
  if (iVar2 <= this->m_outerIndex[row + 1] - iVar4) {
    pSVar3[row] = iVar2 + 1;
    iVar4 = iVar4 + iVar2;
    (this->m_data).m_indices[iVar4] = (StorageIndex)col;
    pSVar1 = (this->m_data).m_values + iVar4;
    *pSVar1 = 0.0;
    return pSVar1;
  }
  __assert_fail("m_innerNonZeros[outer]<=(m_outerIndex[outer+1] - m_outerIndex[outer])",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/SparseCore/SparseMatrix.h"
                ,900,
                "Scalar &Eigen::SparseMatrix<float, 1>::insertBackUncompressed(Index, Index) [_Scalar = float, _Options = 1, _StorageIndex = int]"
               );
}

Assistant:

EIGEN_STRONG_INLINE Scalar& insertBackUncompressed(Index row, Index col)
    {
      const Index outer = IsRowMajor ? row : col;
      const Index inner = IsRowMajor ? col : row;

      eigen_assert(!isCompressed());
      eigen_assert(m_innerNonZeros[outer]<=(m_outerIndex[outer+1] - m_outerIndex[outer]));

      Index p = m_outerIndex[outer] + m_innerNonZeros[outer]++;
      m_data.index(p) = convert_index(inner);
      return (m_data.value(p) = Scalar(0));
    }